

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O0

cupdlp_retcode
cupdlp_ruiz_scaling(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
                   cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  double *pdVar1;
  int len;
  cupdlp_float *y;
  int *in_RDI;
  long in_R9;
  double dVar2;
  int j_3;
  int j_2;
  int j_1;
  int j;
  cupdlp_int i;
  cupdlp_float *current_row_scaling;
  cupdlp_float *current_col_scaling;
  cupdlp_int nCols;
  cupdlp_int nRows;
  cupdlp_retcode retcode;
  ulong local_80;
  cupdlp_float *in_stack_ffffffffffffff88;
  cupdlp_float *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int iVar3;
  int in_stack_ffffffffffffffa8;
  int iVar4;
  CUPDLPcsc *csc_00;
  undefined4 in_stack_ffffffffffffffc0;
  int len_00;
  cupdlp_retcode local_34;
  
  local_34 = 0;
  len = *in_RDI;
  len_00 = in_RDI[1];
  csc_00 = (CUPDLPcsc *)0x0;
  y = (cupdlp_float *)calloc((long)len_00,8);
  if (y == (cupdlp_float *)0x0) {
    local_34 = 1;
  }
  else {
    csc_00 = (CUPDLPcsc *)calloc((long)len,8);
    if (csc_00 == (CUPDLPcsc *)0x0) {
      local_34 = 1;
    }
    else {
      for (iVar4 = 0; iVar4 < *(int *)(in_R9 + 0x24); iVar4 = iVar4 + 1) {
        memset(y,0,(long)len_00 << 3);
        memset(csc_00,0,(long)len << 3);
        if (in_RDI != (int *)0x0) {
          for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < len_00;
              in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
            if (*(int *)(*(long *)(in_RDI + 4) + (long)in_stack_ffffffffffffffa8 * 4) ==
                *(int *)(*(long *)(in_RDI + 4) + (long)(in_stack_ffffffffffffffa8 + 1) * 4)) {
              y[in_stack_ffffffffffffffa8] = 0.0;
            }
            else {
              dVar2 = GenNorm((double *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                              (cupdlp_int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                              (cupdlp_float)in_stack_ffffffffffffff88);
              dVar2 = sqrt(dVar2);
              y[in_stack_ffffffffffffffa8] = dVar2;
            }
          }
        }
        for (iVar3 = 0; iVar3 < len_00; iVar3 = iVar3 + 1) {
          if ((y[iVar3] == 0.0) && (!NAN(y[iVar3]))) {
            y[iVar3] = 1.0;
          }
        }
        if ((*(double *)(in_R9 + 0x28) != INFINITY) || (NAN(*(double *)(in_R9 + 0x28)))) {
          printf("Currently only support infinity norm for Ruiz scaling\n");
          exit(1);
        }
        if ((0 < len) && (in_RDI != (int *)0x0)) {
          for (in_stack_ffffffffffffffa0 = 0;
              in_stack_ffffffffffffffa0 < *(int *)(*(long *)(in_RDI + 4) + (long)len_00 * 4);
              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
            in_stack_ffffffffffffff90 =
                 *(cupdlp_float **)
                  (&csc_00->nRows +
                  (long)*(int *)(*(long *)(in_RDI + 6) + (long)in_stack_ffffffffffffffa0 * 4) * 2);
            pdVar1 = (double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8);
            if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
              in_stack_ffffffffffffff88 =
                   *(cupdlp_float **)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8);
            }
            else {
              in_stack_ffffffffffffff88 =
                   (cupdlp_float *)
                   ((ulong)*(double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8)
                   ^ 0x8000000000000000);
            }
            if ((double)in_stack_ffffffffffffff90 < (double)in_stack_ffffffffffffff88) {
              pdVar1 = (double *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8);
              if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
                local_80 = *(ulong *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8);
              }
              else {
                local_80 = *(ulong *)(*(long *)(in_RDI + 8) + (long)in_stack_ffffffffffffffa0 * 8) ^
                           0x8000000000000000;
              }
              *(ulong *)(&csc_00->nRows +
                        (long)*(int *)(*(long *)(in_RDI + 6) + (long)in_stack_ffffffffffffffa0 * 4)
                        * 2) = local_80;
            }
          }
          for (in_stack_ffffffffffffff9c = 0; in_stack_ffffffffffffff9c < len;
              in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
            if ((*(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffff9c * 2) != 0.0) ||
               (NAN(*(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffff9c * 2)))) {
              dVar2 = sqrt(*(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffff9c * 2));
              *(double *)(&csc_00->nRows + (long)in_stack_ffffffffffffff9c * 2) = dVar2;
            }
            else {
              *(undefined8 *)(&csc_00->nRows + (long)in_stack_ffffffffffffff9c * 2) =
                   0x3ff0000000000000;
            }
          }
        }
        scale_problem(csc_00,(cupdlp_float *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
                      (cupdlp_float *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                      (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      (cupdlp_float *)CONCAT44(len_00,in_stack_ffffffffffffffc0));
        cupdlp_cdot(*(cupdlp_float **)(in_R9 + 0x10),y,len_00);
        cupdlp_cdot(*(cupdlp_float **)(in_R9 + 8),(cupdlp_float *)csc_00,len);
      }
    }
  }
  free(y);
  free(csc_00);
  return local_34;
}

Assistant:

cupdlp_retcode cupdlp_ruiz_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                   cupdlp_float *lower,
                                   cupdlp_float *upper, cupdlp_float *rhs,
                                   CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_ruiz_scaling(CUPDLPwork *work, cupdlp_int max_iter,
// cupdlp_float norm)
{
  cupdlp_retcode retcode = RETCODE_OK;

  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  for (cupdlp_int i = 0; i < scaling->RuizTimes; i++) {
    cupdlp_zero(current_col_scaling, cupdlp_float, nCols);
    cupdlp_zero(current_row_scaling, cupdlp_float, nRows);

    if (csc != NULL) {
      for (int j = 0; j < nCols; j++) {
        if (csc->colMatBeg[j] == csc->colMatBeg[j + 1]) {
          current_col_scaling[j] = 0;
        } else {
          current_col_scaling[j] = SQRTF(GenNorm(
              &csc->colMatElem[csc->colMatBeg[j]],
              csc->colMatBeg[j + 1] - csc->colMatBeg[j], scaling->RuizNorm));
        }
      }
    }
    for (int j = 0; j < nCols; j++) {
      if (current_col_scaling[j] == 0.0) {
        current_col_scaling[j] = 1.0;
      }
    }

    if (scaling->RuizNorm == INFINITY) {
      if (nRows > 0 && csc != NULL) {
        // inf norm of rows of csc
        for (int j = 0; j < csc->colMatBeg[nCols]; j++) {
          if (current_row_scaling[csc->colMatIdx[j]] <
              ABS(csc->colMatElem[j])) {
            current_row_scaling[csc->colMatIdx[j]] = ABS(csc->colMatElem[j]);
          }
        }
        for (int j = 0; j < nRows; j++) {
          if (current_row_scaling[j] == 0.0) {
            current_row_scaling[j] = 1.0;
          } else {
            current_row_scaling[j] = SQRTF(current_row_scaling[j]);
          }
        }
      }
    } else {
      cupdlp_printf("Currently only support infinity norm for Ruiz scaling\n");
      exit(1);
    }

    // apply scaling
    // scale_problem(work, current_col_scaling, current_row_scaling);
    scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                  current_row_scaling);

    // update scaling
    cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
    cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);
  }
exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}